

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>
::AddAllUnbridged(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>
                  *this,BasicFlatModelAPI *be,ItemNamer *vnam)

{
  FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar1;
  bool bVar2;
  bool bVar3;
  LinkEntry be_00;
  size_type sVar4;
  reference cnt;
  ValueNode *this_00;
  int iVar5;
  NodeRange NVar6;
  NodeRange NVar7;
  ValueNode *local_40;
  NodeIndexRange NStack_38;
  
  iVar5 = this->i_2add_next_;
  while( true ) {
    sVar4 = std::
            deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>::Container>_>
            ::size(&this->cons_);
    if ((int)sVar4 <= iVar5) break;
    cnt = std::
          _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>::Container_*>
          ::operator[](&(this->cons_).
                        super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>::Container>_>
                        ._M_impl.super__Deque_impl_data._M_start,(long)this->i_2add_next_);
    bVar2 = cnt->is_unused_ == '\0';
    bVar3 = cnt->is_bridged_ == '\0';
    if (bVar2 && bVar3) {
      BasicFlatModelAPI::
      AddConstraint<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcoshId>>
                (be,(CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>
                     *)cnt);
      pFVar1 = this->cvt_;
      NVar6 = pre::ValueNode::Select
                        (&(this->super_BasicConstraintKeeper).value_node_,this->i_2add_next_,1);
      this_00 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                          (&(this->cvt_->
                            super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            ).value_presolver_.super_ValuePresolverImpl.dest_.cons_,0);
      NVar7 = pre::ValueNode::Add(this_00,1);
      local_40 = NVar7.pvn_;
      NStack_38 = NVar7.ir_;
      be_00.second.pvn_ = local_40;
      be_00.first = NVar6;
      be_00.second.ir_ = NStack_38;
      pre::CopyLink::AddEntry
                (&(pFVar1->
                  super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ).copy_link_,be_00);
    }
    ExportConStatus(this,this->i_2add_next_,cnt,vnam,bVar2 && bVar3);
    iVar5 = this->i_2add_next_ + 1;
    this->i_2add_next_ = iVar5;
  }
  return;
}

Assistant:

void AddAllUnbridged(BasicFlatModelAPI& be,
                       ItemNamer& vnam) {
    auto con_group = GetConstraintGroup(be);
		for ( ; i_2add_next_ < (int)cons_.size(); ++i_2add_next_) {
      const auto& cont = cons_[i_2add_next_];
      bool adding = !cont.IsRedundant();            // includes 'unused'
      if (adding) {
        static_cast<Backend&>(be).AddConstraint(cont.GetCon());
        GetConverter().GetCopyLink().             // Linking to the "final" nodes
            AddEntry({
                       GetValueNode().Select(i_2add_next_),
                       GetConverter().GetValuePresolver().GetTargetNodes().
                         GetConValues()(con_group).Add()
                     });
      }
      ExportConStatus(i_2add_next_, cont, vnam, adding);
    }
  }